

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydata.h
# Opt level: O2

pair<QTypedArrayData<std::pair<QTreeWidgetItem_*,_int>_>_*,_std::pair<QTreeWidgetItem_*,_int>_*>
QTypedArrayData<std::pair<QTreeWidgetItem_*,_int>_>::allocate
          (qsizetype capacity,AllocationOption option)

{
  pair<QTreeWidgetItem_*,_int> *ppVar1;
  long in_FS_OFFSET;
  pair<QTypedArrayData<std::pair<QTreeWidgetItem_*,_int>_>_*,_std::pair<QTreeWidgetItem_*,_int>_*>
  pVar2;
  QArrayData *d;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  d = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  ppVar1 = (pair<QTreeWidgetItem_*,_int> *)QArrayData::allocate(&d,0x10,0x10,capacity,option);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    pVar2.second = ppVar1;
    pVar2.first = (QTypedArrayData<std::pair<QTreeWidgetItem_*,_int>_> *)d;
    return pVar2;
  }
  __stack_chk_fail();
}

Assistant:

[[nodiscard]] static std::pair<QTypedArrayData *, T *> allocate(qsizetype capacity, AllocationOption option = QArrayData::KeepSize)
    {
        static_assert(sizeof(QTypedArrayData) == sizeof(QArrayData));
        QArrayData *d;
        void *result;
        if constexpr (sizeof(T) == 1) {
            // necessarily, alignof(T) == 1
            result = allocate1(&d, capacity, option);
        } else if constexpr (sizeof(T) == 2) {
            // alignof(T) may be 1, but that makes no difference
            result = allocate2(&d, capacity, option);
        } else {
            result = QArrayData::allocate(&d, sizeof(T), alignof(AlignmentDummy), capacity, option);
        }
#if __has_builtin(__builtin_assume_aligned)
        // and yet we do offer results that have stricter alignment
        result = __builtin_assume_aligned(result, Q_ALIGNOF(AlignmentDummy));
#endif
        return {static_cast<QTypedArrayData *>(d), static_cast<T *>(result)};
    }